

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRNetServer.cpp
# Opt level: O1

void __thiscall MinVR::VRNetServer::~VRNetServer(VRNetServer *this)

{
  ulong *puVar1;
  long *plVar2;
  pointer piVar3;
  undefined8 *puVar4;
  ulong uVar5;
  int *piVar6;
  string str;
  ulong *local_c8;
  long local_c0;
  ulong local_b8;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  long *local_a8;
  undefined8 local_a0;
  long local_98;
  undefined8 uStack_90;
  ulong *local_88;
  long local_80;
  ulong local_78 [2];
  ulong *local_68;
  long local_60;
  ulong local_58 [2];
  ulong *local_48;
  long local_40;
  ulong local_38 [2];
  
  (this->super_VRNetInterface)._vptr_VRNetInterface =
       (_func_int **)&PTR_syncEventDataAcrossAllNodes_001768f8;
  local_48 = local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"- ","");
  local_68 = local_58;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,"VRNetServer closing all sockets.","");
  uVar5 = 0xf;
  if (local_48 != local_38) {
    uVar5 = local_38[0];
  }
  if (uVar5 < (ulong)(local_60 + local_40)) {
    uVar5 = 0xf;
    if (local_68 != local_58) {
      uVar5 = local_58[0];
    }
    if (uVar5 < (ulong)(local_60 + local_40)) goto LAB_00129dfb;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_68,0,(char *)0x0,(ulong)local_48);
  }
  else {
LAB_00129dfb:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_48,(ulong)local_68);
  }
  local_c8 = &local_b8;
  puVar1 = puVar4 + 2;
  if ((ulong *)*puVar4 == puVar1) {
    local_b8 = *puVar1;
    uStack_b0 = *(undefined4 *)(puVar4 + 3);
    uStack_ac = *(undefined4 *)((long)puVar4 + 0x1c);
  }
  else {
    local_b8 = *puVar1;
    local_c8 = (ulong *)*puVar4;
  }
  local_c0 = puVar4[1];
  *puVar4 = puVar1;
  puVar4[1] = 0;
  *(undefined1 *)puVar1 = 0;
  local_88 = local_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"\n","");
  uVar5 = 0xf;
  if (local_c8 != &local_b8) {
    uVar5 = local_b8;
  }
  if (uVar5 < (ulong)(local_80 + local_c0)) {
    uVar5 = 0xf;
    if (local_88 != local_78) {
      uVar5 = local_78[0];
    }
    if ((ulong)(local_80 + local_c0) <= uVar5) {
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_88,0,(char *)0x0,(ulong)local_c8);
      goto LAB_00129ee2;
    }
  }
  puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_c8,(ulong)local_88);
LAB_00129ee2:
  local_a8 = &local_98;
  plVar2 = puVar4 + 2;
  if ((long *)*puVar4 == plVar2) {
    local_98 = *plVar2;
    uStack_90 = puVar4[3];
  }
  else {
    local_98 = *plVar2;
    local_a8 = (long *)*puVar4;
  }
  local_a0 = puVar4[1];
  *puVar4 = plVar2;
  puVar4[1] = 0;
  *(undefined1 *)plVar2 = 0;
  if (local_88 != local_78) {
    operator_delete(local_88,local_78[0] + 1);
  }
  if (local_c8 != &local_b8) {
    operator_delete(local_c8,local_b8 + 1);
  }
  if (local_68 != local_58) {
    operator_delete(local_68,local_58[0] + 1);
  }
  if (local_48 != local_38) {
    operator_delete(local_48,local_38[0] + 1);
  }
  std::ostream::write((char *)&std::cout,(long)local_a8);
  if (local_a8 != &local_98) {
    operator_delete(local_a8,local_98 + 1);
  }
  for (piVar6 = (this->_clientSocketFDs).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      piVar6 < (this->_clientSocketFDs).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish; piVar6 = piVar6 + 1) {
    close(*piVar6);
  }
  piVar3 = (this->_clientSocketFDs).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar3 != (pointer)0x0) {
    operator_delete(piVar3,(long)(this->_clientSocketFDs).
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)piVar3);
  }
  return;
}

Assistant:

VRNetServer::~VRNetServer()
{
  VRLOG_STATUS("VRNetServer closing all sockets.");
  for (std::vector<SOCKET>::iterator i=_clientSocketFDs.begin(); i < _clientSocketFDs.end(); i++) {
	#ifdef WIN32
      closesocket(*i);
    #else
      close(*i);
    #endif
  }

#ifdef WIN32
  WSACleanup();
#endif
}